

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_svg_1.0.0.hpp
# Opt level: O0

void __thiscall svg::Font::~Font(Font *this)

{
  Font *in_RDI;
  
  ~Font(in_RDI);
  operator_delete(in_RDI);
  return;
}

Assistant:

Font(double size = 12, std::string const & family = "Verdana") : size(size), family(family) { }